

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall o3dgc::Arithmetic_Codec::put_bit(Arithmetic_Codec *this,uint bit)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  
  uVar3 = this->length >> 1;
  this->length = uVar3;
  if (bit != 0) {
    puVar1 = &this->base;
    uVar5 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    if (CARRY4(uVar5,uVar3)) {
      puVar4 = this->ac_pointer;
      while( true ) {
        puVar2 = puVar4 + -1;
        puVar4 = puVar4 + -1;
        if (*puVar2 != 0xff) break;
        *puVar4 = '\0';
      }
      *puVar4 = *puVar2 + '\x01';
      uVar3 = this->length;
    }
  }
  if (uVar3 < 0x1000000) {
    uVar3 = this->base;
    do {
      puVar4 = this->ac_pointer;
      this->ac_pointer = puVar4 + 1;
      *puVar4 = (uchar)(uVar3 >> 0x18);
      uVar3 = this->base << 8;
      this->base = uVar3;
      uVar5 = this->length << 8;
      this->length = uVar5;
    } while (uVar5 < 0x1000000);
  }
  return;
}

Assistant:

void Arithmetic_Codec::put_bit(unsigned bit)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      if (bit) {
        unsigned init_base = base;
        base += length;                                               // move base
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }